

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_Errors_DD_Errors_Test::
TokenizerTest_Errors_DD_Errors_Test(TokenizerTest_Errors_DD_Errors_Test *this)

{
  TokenizerTest_Errors_DD_Errors_Test *this_local;
  
  TokenizerTest_Errors_DD::TokenizerTest_Errors_DD(&this->super_TokenizerTest_Errors_DD);
  (this->super_TokenizerTest_Errors_DD).super_TokenizerTest.super_Test._vptr_Test =
       (_func_int **)&PTR__TokenizerTest_Errors_DD_Errors_Test_02a1d940;
  return;
}

Assistant:

TEST_2D(TokenizerTest, Errors, kErrorCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kErrorCases_case.input.data(),
                        kErrorCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Ignore all input, except remember if the last token was "foo".
  bool last_was_foo = false;
  while (tokenizer.Next()) {
    last_was_foo = tokenizer.current().text == "foo";
  }

  // Check that the errors match what was expected.
  EXPECT_EQ(kErrorCases_case.errors, error_collector.text_);

  // If the error was recoverable, make sure we saw "foo" after it.
  if (kErrorCases_case.recoverable) {
    EXPECT_TRUE(last_was_foo);
  }
}